

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::ReprintFatalMessage(void)

{
  int iVar1;
  undefined8 uVar2;
  google *this;
  LogDestination *this_00;
  long lVar3;
  bool bVar4;
  
  if (fatal_message != '\0') {
    this = (google *)strlen(&fatal_message);
    if (fLB::FLAGS_logtostderr == '\0') {
      ReprintFatalMessage(this);
    }
    uVar2 = fatal_time;
    if (fLB::FLAGS_logtostderr != '\0') {
      ColoredWriteToStderr(2,&fatal_message,(long)(int)this);
      return;
    }
    lVar3 = 2;
    do {
      iVar1 = fLI::FLAGS_logbuflevel;
      if ((&LogDestination::log_destinations_)[lVar3] == 0) {
        this_00 = (LogDestination *)operator_new(0xe0);
        LogDestination::LogDestination(this_00,(LogSeverity)lVar3,(char *)0x0);
        (&LogDestination::log_destinations_)[lVar3] = this_00;
      }
      (**(code **)(**(long **)((&LogDestination::log_destinations_)[lVar3] + 0xd8) + 0x10))
                (*(long **)((&LogDestination::log_destinations_)[lVar3] + 0xd8),
                 iVar1 < (LogSeverity)lVar3,uVar2,&fatal_message,(ulong)this & 0xffffffff);
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void ReprintFatalMessage() {
  if (fatal_message[0]) {
    const int n = strlen(fatal_message);
    if (!FLAGS_logtostderr) {
      // Also write to stderr (don't color to avoid terminal checks)
      WriteToStderr(fatal_message, n);
    }
    LogDestination::LogToAllLogfiles(GLOG_ERROR, fatal_time, fatal_message, n);
  }
}